

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifyObjLimitReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  Verbosity VVar3;
  element_type *peVar4;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool dualfeasible;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  Verbosity old_verbosity;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffe08;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1f;
  type_conflict5 tVar5;
  Verbosity local_1d8;
  Verbosity local_1d4 [29];
  Verbosity local_160;
  Verbosity local_15c;
  Real local_158;
  Real local_150;
  byte local_145;
  undefined1 local_144 [60];
  bool local_108 [60];
  undefined4 local_cc;
  undefined1 local_c8 [56];
  Verbosity local_90;
  Verbosity local_8c [3];
  undefined8 local_80;
  undefined4 *local_78;
  undefined1 *local_70;
  undefined8 local_68;
  bool *interrupt;
  undefined1 applySimplifier;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *sumviol_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *maxviol;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffffc8;
  
  if ((in_RDI != (cpp_dec_float<50U,_int,_void> *)0xfffffffffffffff8) &&
     (VVar3 = SPxOut::getVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2)), 2 < (int)VVar3)) {
    local_8c[0] = SPxOut::getVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2));
    local_90 = INFO1;
    SPxOut::setVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2),&local_90);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
    soplex::operator<<((SPxOut *)in_stack_fffffffffffffe10,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffe08);
    SPxOut::setVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2),local_8c);
  }
  local_cc = 0;
  local_70 = local_c8;
  local_78 = &local_cc;
  local_80 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_RDI,CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
             in_stack_fffffffffffffe10);
  local_108[0] = false;
  local_108[1] = false;
  local_108[2] = false;
  local_108[3] = false;
  applySimplifier = (undefined1)((ulong)(local_108 + 4) >> 0x38);
  interrupt = local_108;
  local_68 = 0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_RDI,CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
             in_stack_fffffffffffffe10);
  local_144._0_4_ = 0;
  maxviol = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(local_144 + 4);
  sumviol_00 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_144;
  this_00 = (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (in_RDI,CONCAT17(in_stack_fffffffffffffe1f,in_stack_fffffffffffffe18),
             in_stack_fffffffffffffe10);
  local_145 = 1;
  bVar1 = getDualViolation(in_stack_ffffffffffffffc8,maxviol,sumviol_00);
  if (!bVar1) {
    local_145 = 0;
  }
  bVar1 = getRedCostViolation(in_stack_ffffffffffffffc8,maxviol,sumviol_00);
  if (!bVar1) {
    local_145 = 0;
  }
  tVar5 = true;
  if ((local_145 & 1) != 0) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&in_RDI[6].fpclass);
    peVar4 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x47a8af);
    local_150 = Tolerances::floatingPointOpttol(peVar4);
    tVar2 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffffe08,(double *)0x47a8d5);
    tVar5 = true;
    if (!tVar2) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::tolerances((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&in_RDI[6].fpclass);
      peVar4 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x47a8fb);
      local_158 = Tolerances::floatingPointOpttol(peVar4);
      tVar5 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffe08,(double *)0x47a921);
    }
  }
  if (tVar5 != false) {
    if ((in_RDI != (cpp_dec_float<50U,_int,_void> *)0xfffffffffffffff8) &&
       (VVar3 = SPxOut::getVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2)), 4 < (int)VVar3)) {
      local_15c = SPxOut::getVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2));
      local_160 = INFO3;
      SPxOut::setVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2),&local_160);
      in_stack_fffffffffffffe08 =
           (cpp_dec_float<50U,_int,_void> *)
           soplex::operator<<((SPxOut *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08)
      ;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe10,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffe08);
      in_stack_fffffffffffffe10 =
           (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)soplex::operator<<((SPxOut *)in_stack_fffffffffffffe10,
                                 (char *)in_stack_fffffffffffffe08);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe10,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffe08);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe10,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffe08);
      SPxOut::setVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2),&local_15c);
    }
    if ((in_RDI != (cpp_dec_float<50U,_int,_void> *)0xfffffffffffffff8) &&
       (VVar3 = SPxOut::getVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2)), 2 < (int)VVar3)) {
      local_1d4[0] = SPxOut::getVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2));
      local_1d8 = INFO1;
      SPxOut::setVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2),&local_1d8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe10,(char *)in_stack_fffffffffffffe08);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffe10,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffe08);
      SPxOut::setVerbosity((SPxOut *)((in_RDI->data)._M_elems + 2),local_1d4);
    }
    if ((*(long *)(in_RDI[0xbf].data._M_elems + 8) == 0) &&
       (*(long *)(in_RDI[0xbf].data._M_elems + 6) == 0)) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::toggleTerminationValue
                ((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&in_RDI[6].fpclass,false);
    }
    else if ((in_RDI[0x16f].exp & 0x100) != 0) {
      SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::unscaleLPandReloadBasis(in_stack_fffffffffffffe10);
      *(undefined1 *)((long)&in_RDI[0x16f].exp + 1) = 0;
      in_RDI[0x1ae].data._M_elems[6] = in_RDI[0x1ae].data._M_elems[6] + 1;
    }
    _preprocessAndSolveReal(this_00,(bool)applySimplifier,interrupt);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_verifyObjLimitReal()
{
   SPX_MSG_INFO1(spxout, spxout << " --- verifying objective limit" << std::endl;)

   R sumviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   bool dualfeasible = true;

   if(!getDualViolation(dualviol, sumviol))
      dualfeasible = false;

   if(!getRedCostViolation(redcostviol, sumviol))
      dualfeasible = false;

   if(!dualfeasible || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      // if we already disabled simplifier and scaler, next disable the objective limit
      if(_scaler == nullptr && _simplifier == nullptr)
      {
         _solver.toggleTerminationValue(false);
      }
      else if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}